

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.c
# Opt level: O0

void poly1305_compute_mac(mbedtls_poly1305_context *ctx,uchar *mac)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  uint32_t mask_inv;
  uint32_t mask;
  uint32_t acc4;
  uint32_t acc3;
  uint32_t acc2;
  uint32_t acc1;
  uint32_t acc0;
  uint32_t g4;
  uint32_t g3;
  uint32_t g2;
  uint32_t g1;
  uint32_t g0;
  uint64_t d;
  uchar *mac_local;
  mbedtls_poly1305_context *ctx_local;
  
  uVar4 = (ulong)ctx->acc[0] + 5;
  uVar5 = (ulong)ctx->acc[1] + (uVar4 >> 0x20);
  uVar6 = (ulong)ctx->acc[2] + (uVar5 >> 0x20);
  lVar7 = (ulong)ctx->acc[3] + (uVar6 >> 0x20);
  uVar1 = -(ctx->acc[4] + (int)((ulong)lVar7 >> 0x20) >> 2);
  uVar2 = uVar1 ^ 0xffffffff;
  uVar4 = (ulong)(ctx->acc[0] & uVar2 | (uint)uVar4 & uVar1) + (ulong)ctx->s[0];
  uVar5 = (ulong)(ctx->acc[1] & uVar2 | (uint)uVar5 & uVar1) + (ulong)ctx->s[1] + (uVar4 >> 0x20);
  lVar8 = (ulong)(ctx->acc[2] & uVar2 | (uint)uVar6 & uVar1) + (ulong)ctx->s[2] + (uVar5 >> 0x20);
  iVar3 = ctx->s[3] + (int)((ulong)lVar8 >> 0x20) + (ctx->acc[3] & uVar2 | (uint)lVar7 & uVar1);
  *mac = (uchar)uVar4;
  mac[1] = (uchar)(uVar4 >> 8);
  mac[2] = (uchar)(uVar4 >> 0x10);
  mac[3] = (uchar)(uVar4 >> 0x18);
  mac[4] = (uchar)uVar5;
  mac[5] = (uchar)(uVar5 >> 8);
  mac[6] = (uchar)(uVar5 >> 0x10);
  mac[7] = (uchar)(uVar5 >> 0x18);
  mac[8] = (uchar)lVar8;
  mac[9] = (uchar)((ulong)lVar8 >> 8);
  mac[10] = (uchar)((ulong)lVar8 >> 0x10);
  mac[0xb] = (uchar)((ulong)lVar8 >> 0x18);
  mac[0xc] = (uchar)iVar3;
  mac[0xd] = (uchar)((uint)iVar3 >> 8);
  mac[0xe] = (uchar)((uint)iVar3 >> 0x10);
  mac[0xf] = (uchar)((uint)iVar3 >> 0x18);
  return;
}

Assistant:

static void poly1305_compute_mac( const mbedtls_poly1305_context *ctx,
                                  unsigned char mac[16] )
{
    uint64_t d;
    uint32_t g0, g1, g2, g3, g4;
    uint32_t acc0, acc1, acc2, acc3, acc4;
    uint32_t mask;
    uint32_t mask_inv;

    acc0 = ctx->acc[0];
    acc1 = ctx->acc[1];
    acc2 = ctx->acc[2];
    acc3 = ctx->acc[3];
    acc4 = ctx->acc[4];

    /* Before adding 's' we ensure that the accumulator is mod 2^130 - 5.
     * We do this by calculating acc - (2^130 - 5), then checking if
     * the 131st bit is set. If it is, then reduce: acc -= (2^130 - 5)
     */

    /* Calculate acc + -(2^130 - 5) */
    d  = ( (uint64_t) acc0 + 5U );
    g0 = (uint32_t) d;
    d  = ( (uint64_t) acc1 + ( d >> 32 ) );
    g1 = (uint32_t) d;
    d  = ( (uint64_t) acc2 + ( d >> 32 ) );
    g2 = (uint32_t) d;
    d  = ( (uint64_t) acc3 + ( d >> 32 ) );
    g3 = (uint32_t) d;
    g4 = acc4 + (uint32_t) ( d >> 32U );

    /* mask == 0xFFFFFFFF if 131st bit is set, otherwise mask == 0 */
    mask = (uint32_t) 0U - ( g4 >> 2U );
    mask_inv = ~mask;

    /* If 131st bit is set then acc=g, otherwise, acc is unmodified */
    acc0 = ( acc0 & mask_inv ) | ( g0 & mask );
    acc1 = ( acc1 & mask_inv ) | ( g1 & mask );
    acc2 = ( acc2 & mask_inv ) | ( g2 & mask );
    acc3 = ( acc3 & mask_inv ) | ( g3 & mask );

    /* Add 's' */
    d = (uint64_t) acc0 + ctx->s[0];
    acc0 = (uint32_t) d;
    d = (uint64_t) acc1 + ctx->s[1] + ( d >> 32U );
    acc1 = (uint32_t) d;
    d = (uint64_t) acc2 + ctx->s[2] + ( d >> 32U );
    acc2 = (uint32_t) d;
    acc3 += ctx->s[3] + (uint32_t) ( d >> 32U );

    /* Compute MAC (128 least significant bits of the accumulator) */
    mac[ 0] = (unsigned char)( acc0       );
    mac[ 1] = (unsigned char)( acc0 >>  8 );
    mac[ 2] = (unsigned char)( acc0 >> 16 );
    mac[ 3] = (unsigned char)( acc0 >> 24 );
    mac[ 4] = (unsigned char)( acc1       );
    mac[ 5] = (unsigned char)( acc1 >>  8 );
    mac[ 6] = (unsigned char)( acc1 >> 16 );
    mac[ 7] = (unsigned char)( acc1 >> 24 );
    mac[ 8] = (unsigned char)( acc2       );
    mac[ 9] = (unsigned char)( acc2 >>  8 );
    mac[10] = (unsigned char)( acc2 >> 16 );
    mac[11] = (unsigned char)( acc2 >> 24 );
    mac[12] = (unsigned char)( acc3       );
    mac[13] = (unsigned char)( acc3 >>  8 );
    mac[14] = (unsigned char)( acc3 >> 16 );
    mac[15] = (unsigned char)( acc3 >> 24 );
}